

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharedRenderingPerfTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::anon_unknown_0::TestThread::TestThread
          (TestThread *this,
          vector<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
          *contexts)

{
  allocator<char> local_25 [13];
  vector<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
  *local_18;
  vector<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
  *contexts_local;
  TestThread *this_local;
  
  local_18 = contexts;
  contexts_local =
       (vector<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
        *)this;
  de::Thread::Thread(&this->super_Thread);
  (this->super_Thread)._vptr_Thread = (_func_int **)&PTR__TestThread_03278f90;
  std::
  vector<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
  ::vector(&this->m_contexts,contexts);
  this->m_isOk = false;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_errorString,"",local_25);
  std::allocator<char>::~allocator(local_25);
  this->m_beginTimeUs = 0;
  this->m_endTimeUs = 0;
  this->m_joinBeginUs = 0;
  this->m_joinEndUs = 0;
  this->m_startBeginUs = 0;
  this->m_startEndUs = 0;
  return;
}

Assistant:

TestThread::TestThread (const vector<TestContext*> contexts)
	: m_contexts		(contexts)
	, m_isOk			(false)
	, m_errorString		("")
	, m_beginTimeUs		(0)
	, m_endTimeUs		(0)
	, m_joinBeginUs		(0)
	, m_joinEndUs		(0)
	, m_startBeginUs	(0)
	, m_startEndUs		(0)
{
}